

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

void resetLocalOptions(vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records)

{
  HighsOptionType HVar1;
  OptionRecord *pOVar2;
  OptionRecordBool *option;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = (ulong)((long)(option_records->
                        super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)(option_records->
                       super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  uVar5 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    pOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar5];
    HVar1 = pOVar2->type;
    if (HVar1 == kDouble) {
      *pOVar2[1]._vptr_OptionRecord = (_func_int *)pOVar2[1].name._M_string_length;
    }
    else if (HVar1 == kInt) {
      *(undefined4 *)pOVar2[1]._vptr_OptionRecord = *(undefined4 *)&pOVar2[1].field_0xc;
    }
    else if (HVar1 == kBool) {
      *(char *)pOVar2[1]._vptr_OptionRecord = (char)pOVar2[1].type;
    }
    else {
      std::__cxx11::string::_M_assign((string *)pOVar2[1]._vptr_OptionRecord);
    }
  }
  return;
}

Assistant:

void resetLocalOptions(std::vector<OptionRecord*>& option_records) {
  HighsInt num_options = option_records.size();
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = option_records[index]->type;
    if (type == HighsOptionType::kBool) {
      OptionRecordBool& option = ((OptionRecordBool*)option_records[index])[0];
      *(option.value) = option.default_value;
    } else if (type == HighsOptionType::kInt) {
      OptionRecordInt& option = ((OptionRecordInt*)option_records[index])[0];
      *(option.value) = option.default_value;
    } else if (type == HighsOptionType::kDouble) {
      OptionRecordDouble& option =
          ((OptionRecordDouble*)option_records[index])[0];
      *(option.value) = option.default_value;
    } else {
      OptionRecordString& option =
          ((OptionRecordString*)option_records[index])[0];
      *(option.value) = option.default_value;
    }
  }
}